

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeGroup
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UnityBatchedSource *pUVar2;
  cmSourceFile *this_00;
  string filename_00;
  bool bVar3;
  cmValue __k;
  iterator iVar4;
  UnityBatchedSource *__args;
  __node_base _Var5;
  initializer_list<cmLocalGenerator::UnityBatchedSource> __l;
  string filename;
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [48];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
  explicit_mapping;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  sources;
  
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicit_mapping._M_h._M_buckets = &explicit_mapping._M_h._M_single_bucket;
  explicit_mapping._M_h._M_bucket_count = 1;
  explicit_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  explicit_mapping._M_h._M_element_count = 0;
  explicit_mapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  explicit_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  explicit_mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pUVar2 = (filtered_sources->
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pUVar2; __args = __args + 1) {
    this_00 = __args->Source;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,"UNITY_GROUP",(allocator<char> *)&sources);
    __k = cmSourceFile::GetProperty(this_00,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    if (__k.Value != (string *)0x0) {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&explicit_mapping._M_h,__k.Value);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        UnityBatchedSource::UnityBatchedSource((UnityBatchedSource *)local_c8,__args);
        __l._M_len = 1;
        __l._M_array = (iterator)local_c8;
        std::
        vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        ::vector(&sources,__l,(allocator_type *)&filename);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_c8 + 8));
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::__cxx11::string_const&,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&explicit_mapping,__k.Value,(allocator<char> *)&sources);
        std::
        vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        ::~vector(&sources);
      }
      else {
        std::
        vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
        ::emplace_back<cmLocalGenerator::UnityBatchedSource_const&>
                  ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                    *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
                             ._M_cur + 0x28),__args);
      }
    }
  }
  paVar1 = &filename.field_2;
  for (_Var5._M_nxt = explicit_mapping._M_h._M_before_begin._M_nxt;
      _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
    local_c8._8_8_ = (filename_base->_M_dataplus)._M_p;
    local_c8._0_8_ = filename_base->_M_string_length;
    sources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
    sources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6171bf;
    bVar3 = std::operator==(lang,"C");
    local_f0 = "_cxx.cxx";
    if (bVar3) {
      local_f0 = "_c.c";
    }
    cmStrCat<std::__cxx11::string,char_const*>
              (&filename,(cmAlphaNum *)local_c8,(cmAlphaNum *)&sources,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (_Var5._M_nxt + 1),&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p == paVar1) {
      local_d8._8_8_ = filename.field_2._8_8_;
      local_e8 = &local_d8;
    }
    else {
      local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)filename._M_dataplus._M_p;
    }
    local_d8._M_allocated_capacity._1_7_ = filename.field_2._M_allocated_capacity._1_7_;
    local_d8._M_local_buf[0] = filename.field_2._M_local_buf[0];
    local_e0 = filename._M_string_length;
    filename._M_string_length = 0;
    filename.field_2._M_local_buf[0] = '\0';
    filename_00._M_string_length = 0x235074;
    filename_00._M_dataplus._M_p = (pointer)&local_e8;
    filename_00.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
    filename_00.field_2._8_8_ = paVar1;
    filename._M_dataplus._M_p = (pointer)paVar1;
    WriteUnitySource((UnitySource *)local_c8,this,target,configs,
                     *(cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
                       *)(_Var5._M_nxt + 5),beforeInclude,afterInclude,filename_00);
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,(UnitySource *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&filename);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&explicit_mapping._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeGroup(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base)
{
  std::vector<UnitySource> unity_files;

  // sources organized by group name. Drop any source
  // without a group
  std::unordered_map<std::string, std::vector<UnityBatchedSource>>
    explicit_mapping;
  for (UnityBatchedSource const& ubs : filtered_sources) {
    if (cmValue value = ubs.Source->GetProperty("UNITY_GROUP")) {
      auto i = explicit_mapping.find(*value);
      if (i == explicit_mapping.end()) {
        std::vector<UnityBatchedSource> sources{ ubs };
        explicit_mapping.emplace(*value, std::move(sources));
      } else {
        i->second.emplace_back(ubs);
      }
    }
  }

  for (auto const& item : explicit_mapping) {
    auto const& name = item.first;
    std::string filename = cmStrCat(filename_base, "unity_", name,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(item.second), beforeInclude, afterInclude,
      std::move(filename)));
  }

  return unity_files;
}